

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Block::GetTxOutProof
          (ByteData *__return_storage_ptr__,Block *this,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  ByteData local_d0;
  ByteData local_b8;
  undefined1 local_90 [8];
  Serializer obj;
  MerkleBlock merkle_block;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids_local;
  Block *this_local;
  
  MerkleBlock::MerkleBlock((MerkleBlock *)&obj.offset_,this,txids);
  Serializer::Serializer((Serializer *)local_90);
  SerializeBlockHeader(&local_b8,this);
  Serializer::AddDirectBytes((Serializer *)local_90,&local_b8);
  ByteData::~ByteData(&local_b8);
  MerkleBlock::Serialize(&local_d0,(MerkleBlock *)&obj.offset_);
  Serializer::AddDirectBytes((Serializer *)local_90,&local_d0);
  ByteData::~ByteData(&local_d0);
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_90);
  Serializer::~Serializer((Serializer *)local_90);
  MerkleBlock::~MerkleBlock((MerkleBlock *)&obj.offset_);
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const std::vector<Txid>& txids) const {
  MerkleBlock merkle_block(*this, txids);
  Serializer obj;
  obj.AddDirectBytes(SerializeBlockHeader());
  obj.AddDirectBytes(merkle_block.Serialize());
  return obj.Output();
}